

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O1

void __thiscall
Projection::initialSyncProject
          (Projection *this,int c_lev,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *sig,Real dt,Real strt_time,
          int have_divu)

{
  pointer ppAVar1;
  unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> uVar2;
  long *plVar3;
  FabArrayBase *fabarray_;
  AmrLevel *pAVar4;
  _func_int *p_Var5;
  Projection *pPVar6;
  undefined1 auVar7 [8];
  pointer puVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  bool bVar10;
  TimeCenter TVar11;
  long lVar12;
  _func_int **pp_Var13;
  undefined8 *puVar14;
  MultiFab *pMVar15;
  NavierStokesBase *pNVar16;
  FabArray<amrex::FArrayBox> *pFVar17;
  FabArray<amrex::FArrayBox> *pFVar18;
  long lVar19;
  undefined4 in_register_0000000c;
  BoxArray *grids;
  pointer *ppbVar20;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar21;
  undefined8 extraout_RDX_06;
  long lVar22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var23;
  int iVar24;
  _Bit_pointer puVar25;
  long lVar26;
  int iVar27;
  pointer *ppbVar28;
  long lVar29;
  long lVar30;
  double dVar31;
  int Divu_Type;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> vel;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> phi;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  rhcc;
  int Divu;
  MFIter mfi;
  MultiFab v_fine;
  int local_4ec;
  double local_4e8;
  int local_4dc;
  Projection *local_4d8;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_4d0;
  undefined1 local_4c8 [8];
  undefined1 auStack_4c0 [56];
  int local_488;
  undefined4 uStack_484;
  undefined4 local_47c;
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  local_478;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_460;
  element_type *local_458;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_450;
  FabArray<amrex::FArrayBox> *local_448;
  FabArray<amrex::FArrayBox> *local_440;
  pointer local_438;
  _Bit_type *local_430;
  double local_428;
  FabArray<amrex::FArrayBox> *local_420;
  long local_418;
  _Bit_pointer local_410;
  long local_408;
  long local_400;
  RefID local_3f8;
  RefID local_3f0;
  Box local_3e8;
  int local_3cc;
  undefined1 local_3c8 [24];
  pointer pbStack_3b0;
  undefined8 local_3a8;
  int local_3a0;
  undefined1 local_388 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378 [7];
  int local_2bc;
  Array4<double> local_1f8;
  undefined1 local_1b8 [24];
  pointer pbStack_1a0;
  undefined8 local_198;
  int local_190;
  
  grids = (BoxArray *)CONCAT44(in_register_0000000c,have_divu);
  iVar27 = *(int *)&(this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  lVar12 = (long)iVar27;
  local_4dc = have_divu;
  local_4d0 = sig;
  local_460._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)strt_time;
  local_458 = (element_type *)dt;
  if (verbose != 0) {
    local_388._8_8_ = amrex::OutStream();
    local_388._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
    local_388._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
    grids = *(BoxArray **)
             ((long)local_378[0].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - 0x18);
    *(undefined8 *)
     ((long)&local_378[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + (long)grids) =
         *(undefined8 *)
          ((long)&(((BoxArray *)(local_388._8_8_ + 8))->m_bat).m_bat_type +
          (long)(*(_func_int ***)local_388._8_8_)[-3]);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_378,"Projection::initialSyncProject(): levels = ",0x2b);
    std::ostream::operator<<((ostringstream *)local_378,c_lev);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378," - ",3);
    std::ostream::operator<<((ostringstream *)local_378,iVar27);
    local_1b8[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,local_1b8,1);
    amrex::Print::~Print((Print *)local_388);
  }
  if ((verbose != 0) && ((anonymous_namespace)::benchmarking == '\x01')) {
    amrex::ParallelDescriptor::Barrier((string *)amrex::ParallelDescriptor::Unnamed_abi_cxx11_);
  }
  local_438 = (pointer)amrex::ParallelDescriptor::second();
  local_4c8 = (undefined1  [8])0x0;
  auStack_4c0._0_8_ = 0;
  auStack_4c0._8_8_ = 0;
  pp_Var13 = (_func_int **)operator_new(0x50);
  auStack_4c0._0_8_ = pp_Var13 + 10;
  pp_Var13[8] = (_func_int *)0x0;
  pp_Var13[9] = (_func_int *)0x0;
  pp_Var13[6] = (_func_int *)0x0;
  pp_Var13[7] = (_func_int *)0x0;
  pp_Var13[4] = (_func_int *)0x0;
  pp_Var13[5] = (_func_int *)0x0;
  pp_Var13[2] = (_func_int *)0x0;
  pp_Var13[3] = (_func_int *)0x0;
  *pp_Var13 = (_func_int *)0x0;
  pp_Var13[1] = (_func_int *)0x0;
  auStack_4c0._24_8_ = 0;
  auStack_4c0._32_8_ = 0;
  auStack_4c0._40_8_ = 0;
  local_4c8 = (undefined1  [8])pp_Var13;
  auStack_4c0._8_8_ = auStack_4c0._0_8_;
  puVar14 = (undefined8 *)operator_new(0x50);
  auStack_4c0._32_8_ = puVar14 + 10;
  puVar14[8] = 0;
  puVar14[9] = 0;
  puVar14[6] = 0;
  puVar14[7] = 0;
  puVar14[4] = 0;
  puVar14[5] = 0;
  puVar14[2] = 0;
  puVar14[3] = 0;
  *puVar14 = 0;
  puVar14[1] = 0;
  auStack_4c0._24_8_ = puVar14;
  auStack_4c0._40_8_ = auStack_4c0._32_8_;
  if (c_lev <= iVar27) {
    lVar22 = (long)c_lev;
    iVar24 = (iVar27 - c_lev) + 1;
    do {
      ppAVar1 = (this->LevelData).
                super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pp_Var13[lVar22] =
           *(_func_int **)
            (*(long *)&(ppAVar1[lVar22]->state).
                       super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                       super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_> + 200
            );
      pFVar18 = *(FabArray<amrex::FArrayBox> **)
                 (*(long *)&(ppAVar1[lVar22]->state).
                            super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                            super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                 + 0x1b0);
      puVar14[lVar22] = pFVar18;
      grids = (BoxArray *)&(pFVar18->super_FabArrayBase).n_grow;
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (pFVar18,0.0,0,(pFVar18->super_FabArrayBase).n_comp,(IntVect *)grids);
      lVar22 = lVar22 + 1;
      iVar24 = iVar24 + -1;
    } while (iVar24 != 0);
  }
  local_478.
  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_478.
  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_478.
  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4d8 = this;
  if (local_4dc != 0) {
    std::
    vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::resize(&local_478,10);
    if (c_lev <= iVar27) {
      local_428 = 1.0 / (double)local_458;
      local_430 = (_Bit_type *)((double)local_458 + (double)local_460._M_pi);
      p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)c_lev;
      local_47c = iVar27 + 1;
      do {
        ppbVar28 = &local_378[0].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        uVar2._M_t.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
        _M_t.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
        super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
             (this->parent->amr_level).
             super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(long)p_Var23]._M_t;
        local_388._0_8_ = local_378;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"divu","");
        bVar10 = amrex::AmrLevel::isStateVariable((string *)local_388,&local_4ec,&local_3cc);
        if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_388._0_8_ != local_378) {
          operator_delete((void *)local_388._0_8_,
                          (ulong)((long)local_378[0].
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1));
        }
        if (!bVar10) {
          amrex::Error_host("Projection::initialSyncProject(): Divu not found");
        }
        pFVar18 = *(FabArray<amrex::FArrayBox> **)
                   (*(long *)((long)uVar2._M_t.
                                    super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                    .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                             0x170) + 200 + (long)local_4ec * 0xe0);
        pFVar17 = *(FabArray<amrex::FArrayBox> **)
                   (*(long *)((long)uVar2._M_t.
                                    super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                    .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                             0x170) + 0xd0 + (long)local_4ec * 0xe0);
        local_450._M_pi = p_Var23;
        amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>(pFVar18,false);
        amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>(pFVar17,false);
        lVar22 = *(long *)((long)uVar2._M_t.
                                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                 .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                          0x170) + (long)local_4ec * 0xe0;
        TVar11 = amrex::StateDescriptor::timeType
                           (*(StateDescriptor **)
                             (*(long *)((long)uVar2._M_t.
                                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>.
                                              _M_head_impl + 0x170) + 8 + (long)local_4ec * 0xe0));
        if (TVar11 == Point) {
          dVar31 = *(double *)(lVar22 + 0xc0);
        }
        else {
          dVar31 = (*(double *)(lVar22 + 0xb8) + *(double *)(lVar22 + 0xc0)) * 0.5;
        }
        lVar22 = *(long *)((long)uVar2._M_t.
                                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                 .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                          0x170) + (long)local_4ec * 0xe0;
        TVar11 = amrex::StateDescriptor::timeType
                           (*(StateDescriptor **)
                             (*(long *)((long)uVar2._M_t.
                                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>.
                                              _M_head_impl + 0x170) + 8 + (long)local_4ec * 0xe0));
        if (TVar11 == Point) {
          local_4e8 = *(double *)(lVar22 + 0xb0);
        }
        else {
          local_4e8 = (*(double *)(lVar22 + 0xa8) + *(double *)(lVar22 + 0xb0)) * 0.5;
        }
        amrex::MFIter::MFIter((MFIter *)local_388,&pFVar18->super_FabArrayBase,'\0');
        while ((int)local_378[0].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ <
               (int)local_378[1].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start._0_4_) {
          ppbVar20 = ppbVar28;
          if (local_378[2].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            ppbVar20 = (pointer *)
                       ((long)(int)local_378[0].
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ * 4 +
                       *(long *)local_378[2].
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          }
          (**(code **)(*(long *)uVar2._M_t.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xf0
                      ))(dVar31,uVar2._M_t.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                         (pFVar17->m_fabs_v).
                         super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar20],local_4ec,0,0,1
                        );
          ppbVar20 = ppbVar28;
          if (local_378[2].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            ppbVar20 = (pointer *)
                       ((long)(int)local_378[0].
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ * 4 +
                       *(long *)local_378[2].
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          }
          (**(code **)(*(long *)uVar2._M_t.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xf0
                      ))(local_4e8,
                         uVar2._M_t.
                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                         .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                         (pFVar18->m_fabs_v).
                         super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar20],local_4ec,0,0,1
                        );
          amrex::MFIter::operator++((MFIter *)local_388);
        }
        amrex::MFIter::~MFIter((MFIter *)local_388);
        puVar8 = local_478.
                 super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pMVar15 = (MultiFab *)operator_new(0x180);
        local_388._0_8_ = (pointer)0x1;
        local_378[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_378[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_388._8_8_ = (FabArrayBase *)0x0;
        local_378[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        amrex::MultiFab::MultiFab
                  (pMVar15,(BoxArray *)
                           ((long)uVar2._M_t.
                                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                  .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                           0xd8),
                   (DistributionMapping *)
                   ((long)uVar2._M_t.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x140),1,1
                   ,(MFInfo *)local_388,
                   *(FabFactory<amrex::FArrayBox> **)
                    ((long)uVar2._M_t.
                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x218));
        _Var9._M_pi = local_450._M_pi;
        plVar3 = *(long **)((long)(&((Box *)((long)puVar8 + 0x18))->smallend + -2) +
                           (long)local_450._M_pi * 8);
        *(MultiFab **)
         ((long)(&((Box *)((long)puVar8 + 0x18))->smallend + -2) + (long)local_450._M_pi * 8) =
             pMVar15;
        if (plVar3 != (long *)0x0) {
          (**(code **)(*plVar3 + 8))();
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_378);
        local_440 = *(FabArray<amrex::FArrayBox> **)
                     ((long)(&((Box *)((long)local_478.
                                             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + 0x18))->
                              smallend + -2) + (long)_Var9._M_pi * 8);
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (local_440,0.0,0,(local_440->super_FabArrayBase).n_comp,
                   &(local_440->super_FabArrayBase).n_grow);
        grids = (BoxArray *)0x0;
        pNVar16 = (NavierStokesBase *)
                  __dynamic_cast((__uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                  )(local_4d8->parent->amr_level).
                                   super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                   .
                                   super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[(long)_Var9._M_pi]._M_t
                                 ,&amrex::AmrLevel::typeinfo,&NavierStokesBase::typeinfo);
        pFVar17 = &NavierStokesBase::getDivCond(pNVar16,1,(Real)local_460._M_pi)->
                   super_FabArray<amrex::FArrayBox>;
        pFVar18 = &NavierStokesBase::getDivCond(pNVar16,1,(Real)local_430)->
                   super_FabArray<amrex::FArrayBox>;
        local_448 = pFVar18;
        amrex::MFIter::MFIter((MFIter *)local_388,&local_440->super_FabArrayBase,true);
        local_420 = pFVar17;
        if ((int)local_378[0].
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ <
            (int)local_378[1].
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._0_4_) {
          do {
            pFVar17 = local_420;
            amrex::MFIter::growntilebox(&local_3e8,(MFIter *)local_388,-1000000);
            amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((Array4<double> *)local_1b8,pFVar17,(MFIter *)local_388);
            amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((Array4<double> *)local_3c8,pFVar18,(MFIter *)local_388);
            amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_1f8,local_440,(MFIter *)local_388);
            grids = (BoxArray *)(ulong)(uint)local_3e8.smallend.vect[2];
            if (local_3e8.smallend.vect[2] <= local_3e8.bigend.vect[2]) {
              lVar22 = (long)local_3e8.smallend.vect[1];
              lVar29 = (long)local_3e8.smallend.vect[0];
              local_400 = (lVar22 - local_1f8.begin.y) * local_1f8.jstride * 8 + lVar29 * 8 +
                          (long)local_1f8.begin.x * -8 + (long)local_1f8.p;
              local_3f0.data = (Ref *)(local_1f8.kstride * 8);
              local_3f8.data = (BARef *)-(long)local_1f8.begin.z;
              local_408 = (lVar22 - local_198._4_4_) * local_1b8._8_8_ * 8 + lVar29 * 8 +
                          (long)(int)local_198 * -8 + local_1b8._0_8_;
              local_4e8 = (double)(local_1b8._16_8_ * 8);
              _local_488 = -(long)local_190;
              local_410 = (_Bit_pointer)
                          ((lVar22 - local_3a8._4_4_) * local_3c8._8_8_ * 8 + lVar29 * 8 +
                           (long)(int)local_3a8 * -8 + local_3c8._0_8_);
              auStack_4c0._16_8_ = local_3c8._16_8_ * 8;
              local_418 = -(long)local_3a0;
              do {
                iVar24 = (int)grids;
                if (local_3e8.smallend.vect[1] <= local_3e8.bigend.vect[1]) {
                  lVar29 = (long)iVar24;
                  lVar30 = ((long)(&((local_3f8.data)->bbox).smallend + -2) + lVar29) *
                           (long)local_3f0.data + local_400;
                  lVar26 = (_local_488 + lVar29) * (long)local_4e8 + local_408;
                  puVar25 = (_Bit_pointer)
                            ((lVar29 + local_418) * auStack_4c0._16_8_ + (long)local_410);
                  lVar29 = lVar22;
                  do {
                    if (local_3e8.smallend.vect[0] <= local_3e8.bigend.vect[0]) {
                      lVar19 = 0;
                      do {
                        *(double *)(lVar30 + lVar19 * 8) =
                             ((double)puVar25[lVar19] - *(double *)(lVar26 + lVar19 * 8)) *
                             local_428;
                        lVar19 = lVar19 + 1;
                      } while ((local_3e8.bigend.vect[0] - local_3e8.smallend.vect[0]) + 1 !=
                               (int)lVar19);
                    }
                    lVar29 = lVar29 + 1;
                    lVar30 = lVar30 + local_1f8.jstride * 8;
                    lVar26 = lVar26 + local_1b8._8_8_ * 8;
                    puVar25 = puVar25 + local_3c8._8_8_;
                  } while (local_3e8.bigend.vect[1] + 1 != (int)lVar29);
                }
                grids = (BoxArray *)(ulong)(iVar24 + 1);
              } while (iVar24 != local_3e8.bigend.vect[2]);
            }
            amrex::MFIter::operator++((MFIter *)local_388);
            pFVar18 = local_448;
          } while ((int)local_378[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ <
                   (int)local_378[1].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._0_4_);
        }
        pFVar17 = local_420;
        amrex::MFIter::~MFIter((MFIter *)local_388);
        if (pFVar18 != (FabArray<amrex::FArrayBox> *)0x0) {
          (*(((FabArray<amrex::FArrayBox> *)&pFVar18->super_FabArrayBase)->super_FabArrayBase).
            _vptr_FabArrayBase[1])(pFVar18);
        }
        _Var9._M_pi = local_450._M_pi;
        this = local_4d8;
        if (pFVar17 != (FabArray<amrex::FArrayBox> *)0x0) {
          (*(((FabArray<amrex::FArrayBox> *)&pFVar17->super_FabArrayBase)->super_FabArrayBase).
            _vptr_FabArrayBase[1])(pFVar17);
        }
        p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&(_Var9._M_pi)->_vptr__Sp_counted_base + 1);
      } while (local_47c != (int)p_Var23);
    }
  }
  auVar7 = local_4c8;
  if (c_lev <= iVar27) {
    grids = (BoxArray *)(ulong)(uint)c_lev;
    lVar22 = (long)c_lev;
    iVar24 = (iVar27 - c_lev) + 1;
    do {
      amrex::FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
                (*(FabArray<amrex::FArrayBox> **)((long)auVar7 + lVar22 * 8),1e+200,0,3);
      amrex::FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
                (*(FabArray<amrex::FArrayBox> **)
                  (*(long *)&((this->LevelData).
                              super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                              super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar22]->state).
                             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                  + 0xd0),1e+200,0,3);
      pFVar18 = &(local_4d0->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                 super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar22]->super_FabArray<amrex::FArrayBox>;
      amrex::FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
                (pFVar18,1e+200,0,(pFVar18->super_FabArrayBase).n_comp);
      lVar22 = lVar22 + 1;
      iVar24 = iVar24 + -1;
    } while (iVar24 != 0);
  }
  if (c_lev <= iVar27) {
    ppbVar28 = &local_378[0].
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    auStack_4c0._16_8_ = local_4c8;
    lVar22 = (long)c_lev;
    local_488 = iVar27 + 1;
    do {
      lVar29 = *(long *)&((this->LevelData).
                          super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                          super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar22]->state).
                         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>;
      lVar26 = *(long *)(lVar29 + 0xd0);
      fabarray_ = *(FabArrayBase **)(lVar29 + 200);
      TVar11 = amrex::StateDescriptor::timeType(*(StateDescriptor **)(lVar29 + 8));
      if (TVar11 == Point) {
        dVar31 = *(double *)(lVar29 + 0xc0);
      }
      else {
        dVar31 = (*(double *)(lVar29 + 0xb8) + *(double *)(lVar29 + 0xc0)) * 0.5;
      }
      lVar29 = *(long *)&((local_4d8->LevelData).
                          super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                          super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar22]->state).
                         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>;
      TVar11 = amrex::StateDescriptor::timeType(*(StateDescriptor **)(lVar29 + 8));
      if (TVar11 == Point) {
        local_4e8 = *(double *)(lVar29 + 0xb0);
      }
      else {
        local_4e8 = (*(double *)(lVar29 + 0xa8) + *(double *)(lVar29 + 0xb0)) * 0.5;
      }
      amrex::MFIter::MFIter((MFIter *)local_388,fabarray_,'\0');
      this = local_4d8;
      while ((int)local_378[0].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ <
             (int)local_378[1].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_4_) {
        ppbVar20 = ppbVar28;
        if (local_378[2].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          ppbVar20 = (pointer *)
                     ((long)(int)local_378[0].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ * 4 +
                     *(long *)local_378[2].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        }
        pAVar4 = (this->LevelData).
                 super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                 super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar22];
        (*pAVar4->_vptr_AmrLevel[0x1e])
                  (dVar31,pAVar4,
                   *(undefined8 *)(*(long *)(lVar26 + 0x108) + (long)*(int *)ppbVar20 * 8),0,0,0,3);
        ppbVar20 = ppbVar28;
        if (local_378[2].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          ppbVar20 = (pointer *)
                     ((long)(int)local_378[0].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ * 4 +
                     *(long *)local_378[2].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        }
        pAVar4 = (this->LevelData).
                 super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                 super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar22];
        grids = (BoxArray *)0x0;
        (*pAVar4->_vptr_AmrLevel[0x1e])
                  (local_4e8,pAVar4,
                   *(undefined8 *)
                    (*(long *)((long)&fabarray_[1].boxarray.m_bat.m_op + 0xc) +
                    (long)*(int *)ppbVar20 * 8),0,0,0,3);
        amrex::MFIter::operator++((MFIter *)local_388);
      }
      amrex::MFIter::~MFIter((MFIter *)local_388);
      ConvertUnew(this,*(MultiFab **)(auStack_4c0._16_8_ + lVar22 * 8),
                  *(MultiFab **)
                   (*(long *)&((this->LevelData).
                               super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                               super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar22]->state).
                              super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                              super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                   + 0xd0),(Real)local_458,grids);
      lVar22 = lVar22 + 1;
    } while (local_488 != (int)lVar22);
  }
  bVar10 = OutFlowBC::HasOutFlowBC(this->phys_bc);
  pMVar15 = (MultiFab *)CONCAT71((int7)((ulong)grids >> 8),local_4dc == 0);
  uVar21 = extraout_RDX;
  if ((bVar10 && local_4dc != 0) && (do_outflow_bcs != 0)) {
    amrex::GetVecOfPtrs<amrex::MultiFab>
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_388,
               (Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)&local_478);
    pMVar15 = (MultiFab *)local_4c8;
    set_outflow_bcs(this,0x3ec,
                    (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                    (auStack_4c0 + 0x18),
                    (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)pMVar15,
                    (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_388,
                    local_4d0,c_lev,iVar27,local_4dc);
    uVar21 = extraout_RDX_00;
    if ((pointer)local_388._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_388._0_8_,
                      (long)local_378[0].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start - local_388._0_8_);
      uVar21 = extraout_RDX_01;
    }
  }
  if (c_lev <= iVar27) {
    lVar22 = (long)c_lev;
    do {
      scaleVar(this,(local_4d0->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>)
                    .super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar22],(int)uVar21,pMVar15,(int)lVar22
              );
      lVar22 = lVar22 + 1;
      uVar21 = extraout_RDX_02;
    } while (iVar27 + 1 != (int)lVar22);
  }
  auVar7 = local_4c8;
  if (c_lev < iVar27) {
    local_4e8 = (double)(long)c_lev;
    do {
      pPVar6 = local_4d8;
      p_Var5 = *(_func_int **)((long)auVar7 + lVar12 * 8);
      local_1b8._0_8_ = (pointer)0x1;
      pbStack_1a0 = (pointer)0x0;
      local_198 = (pointer)0x0;
      local_1b8._8_8_ = (Arena *)0x0;
      local_1b8._16_8_ = (pointer)0x0;
      amrex::MultiFab::MultiFab
                ((MultiFab *)local_388,
                 (BoxArray *)(*(_func_int **)((long)auVar7 + (lVar12 + -1) * 8) + 8),
                 (DistributionMapping *)(*(_func_int **)((long)auVar7 + (lVar12 + -1) * 8) + 0x70),3
                 ,1,(MFInfo *)local_1b8,
                 (FabFactory<amrex::FArrayBox> *)
                 ((local_4d8->LevelData).
                  super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                  super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar12 + -1]->m_factory)._M_t.
                 super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                );
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1b8 + 0x10));
      local_3c8._0_8_ = (double *)0x1;
      pbStack_3b0 = (pointer)0x0;
      local_3a8 = (pointer)0x0;
      local_3c8._8_8_ = (Arena *)0x0;
      local_3c8._16_8_ = (pointer)0x0;
      amrex::MultiFab::MultiFab
                ((MultiFab *)local_1b8,(BoxArray *)(p_Var5 + 8),
                 (DistributionMapping *)(p_Var5 + 0x70),3,1,(MFInfo *)local_3c8,
                 (FabFactory<amrex::FArrayBox> *)
                 ((pPVar6->LevelData).
                  super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                  super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar12]->m_factory)._M_t.
                 super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                );
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_3c8 + 0x10));
      amrex::MultiFab::Copy
                ((MultiFab *)local_388,*(MultiFab **)((long)auVar7 + (lVar12 + -1) * 8),0,0,3,1);
      amrex::MultiFab::Copy((MultiFab *)local_1b8,*(MultiFab **)((long)auVar7 + lVar12 * 8),0,0,3,1)
      ;
      pNVar16 = (NavierStokesBase *)
                __dynamic_cast((local_4d8->LevelData).
                               super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                               super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar12 + -1],
                               &amrex::AmrLevel::typeinfo,&NavierStokesBase::typeinfo);
      NavierStokesBase::average_down
                (pNVar16,(MultiFab *)local_1b8,(MultiFab *)local_388,0,local_2bc);
      amrex::MultiFab::Copy
                (*(MultiFab **)((long)auVar7 + (lVar12 + -1) * 8),(MultiFab *)local_388,0,0,3,1);
      lVar12 = lVar12 + -1;
      amrex::MultiFab::~MultiFab((MultiFab *)local_1b8);
      amrex::MultiFab::~MultiFab((MultiFab *)local_388);
    } while ((long)local_4e8 < lVar12);
  }
  pPVar6 = local_4d8;
  if ((local_4dc != 0) && (c_lev <= iVar27)) {
    lVar12 = (long)c_lev;
    iVar24 = (iVar27 - c_lev) + 1;
    do {
      amrex::MultiFab::mult
                (*(MultiFab **)
                  ((long)(&((Box *)((long)local_478.
                                          super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 0x18))->
                           smallend + -2) + lVar12 * 8),-1.0,0,1,0);
      lVar12 = lVar12 + 1;
      iVar24 = iVar24 + -1;
    } while (iVar24 != 0);
  }
  amrex::GetVecOfPtrs<amrex::MultiFab>
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_388,
             (Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
              *)&local_478);
  local_1b8._0_8_ = (pointer)0x0;
  local_1b8._8_8_ = (Arena *)0x0;
  local_1b8._16_8_ = (pointer)0x0;
  pMVar15 = (MultiFab *)local_4c8;
  doMLMGNodalProjection
            (pPVar6,c_lev,(iVar27 - c_lev) + 1,
             (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)pMVar15,
             (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)(auStack_4c0 + 0x18),
             local_4d0,(Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_388,
             (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_1b8,proj_tol,
             proj_abs_tol,true,(MultiFab *)0x0,(MultiFab *)0x0,false);
  uVar21 = extraout_RDX_03;
  if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ - local_1b8._0_8_);
    uVar21 = extraout_RDX_04;
  }
  if ((pointer)local_388._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_388._0_8_,
                    (long)local_378[0].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start - local_388._0_8_);
    uVar21 = extraout_RDX_05;
  }
  if (c_lev <= iVar27) {
    lVar12 = (long)c_lev;
    do {
      rescaleVar(pPVar6,(local_4d0->
                        super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar12],(int)uVar21,pMVar15,
                 (int)lVar12);
      lVar12 = lVar12 + 1;
      uVar21 = extraout_RDX_06;
    } while (iVar27 + 1 != (int)lVar12);
  }
  uVar21 = auStack_4c0._24_8_;
  if (c_lev <= iVar27) {
    lVar12 = (long)c_lev;
    iVar27 = (iVar27 - c_lev) + 1;
    do {
      amrex::MultiFab::Add
                (*(MultiFab **)
                  (*(long *)&((pPVar6->LevelData).
                              super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                              super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar12]->state).
                             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                  + 0x1a8),*(MultiFab **)(uVar21 + lVar12 * 8),0,0,1,1);
      lVar12 = lVar12 + 1;
      iVar27 = iVar27 + -1;
    } while (iVar27 != 0);
  }
  if (verbose != 0) {
    dVar31 = amrex::ParallelDescriptor::second();
    local_388._8_8_ = amrex::OutStream();
    local_388._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
    local_388._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
    *(undefined8 *)
     ((long)&local_378[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish +
     *(size_type *)
      ((long)local_378[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start - 0x18)) =
         *(undefined8 *)
          ((long)&(((BoxArray *)(local_388._8_8_ + 8))->m_bat).m_bat_type +
          (long)(*(_func_int ***)local_388._8_8_)[-3]);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_378,"Projection::initialSyncProject(): time: ",0x28);
    std::ostream::_M_insert<double>(dVar31 - (double)local_438);
    local_1b8[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_378,local_1b8,1);
    amrex::Print::~Print((Print *)local_388);
  }
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::~vector(&local_478);
  if ((undefined8 *)auStack_4c0._24_8_ != (undefined8 *)0x0) {
    operator_delete((void *)auStack_4c0._24_8_,auStack_4c0._40_8_ - auStack_4c0._24_8_);
  }
  if (local_4c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_4c8,auStack_4c0._8_8_ - (long)local_4c8);
  }
  return;
}

Assistant:

void
Projection::initialSyncProject (int       c_lev,
                                const Vector<MultiFab*> sig,
                                Real      dt,
                                Real      strt_time,
                                int       have_divu)
{
    int lev;
    int f_lev = parent->finestLevel();

    if (verbose)
      amrex::Print() << "Projection::initialSyncProject(): levels = " << c_lev << " - " << f_lev << '\n';

    if (verbose && benchmarking) ParallelDescriptor::Barrier();

    const Real stime = ParallelDescriptor::second();

    //
    // Gather data.
    //
    Vector<MultiFab*> vel(maxlev, nullptr);
    Vector<MultiFab*> phi(maxlev, nullptr);

    for (lev = c_lev; lev <= f_lev; lev++)
    {
        vel[lev] = &(LevelData[lev]->get_new_data(State_Type));
        // phi points to P_old and we use it as a temporary to
        // store phi resulting from the nodal projection, AKA
        // the pressure increment
        phi[lev] = &(LevelData[lev]->get_old_data(Press_Type));
        phi[lev] -> setVal(0.0);
    }

    const Real dt_inv = 1./dt;

    //
    // Source term
    //
    Vector<std::unique_ptr<MultiFab> > rhcc;
    if (have_divu)
    {
        rhcc.resize(maxlev);

        //
        // Set up rhcc for manual project.
        //
        for (lev = c_lev; lev <= f_lev; lev++)
        {
            AmrLevel& amr_level = parent->getLevel(lev);

            int Divu_Type, Divu;
            if (!LevelData[c_lev]->isStateVariable("divu", Divu_Type, Divu))
                amrex::Error("Projection::initialSyncProject(): Divu not found");
            //
            // Make sure ghost cells are properly filled.
            //
            MultiFab& divu_new = amr_level.get_new_data(Divu_Type);
            MultiFab& divu_old = amr_level.get_old_data(Divu_Type);
            divu_new.FillBoundary();
            divu_old.FillBoundary();

            Real prev_time = amr_level.get_state_data(Divu_Type).prevTime();
            Real curr_time = amr_level.get_state_data(Divu_Type).curTime();

            for (MFIter mfi(divu_new); mfi.isValid(); ++mfi)
            {
                amr_level.setPhysBoundaryValues(divu_old[mfi],Divu_Type,prev_time,0,0,1);
                amr_level.setPhysBoundaryValues(divu_new[mfi],Divu_Type,curr_time,0,0,1);
            }

	    // Needed for set_outflow_bcs(). MLMG ignores rh ghost cells.
            const int nghost = 1;
            rhcc[lev].reset(new MultiFab(amr_level.boxArray(),
                            amr_level.DistributionMap(),
                            1,nghost,MFInfo(),amr_level.Factory()));
            MultiFab* rhcclev = rhcc[lev].get();
            rhcclev->setVal(0);

            NavierStokesBase* ns = dynamic_cast<NavierStokesBase*>(&parent->getLevel(lev));

            AMREX_ASSERT(!(ns == 0));

            std::unique_ptr<MultiFab> divu (ns->getDivCond(nghost,strt_time));
            std::unique_ptr<MultiFab> dsdt (ns->getDivCond(nghost,strt_time+dt));

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(*rhcclev,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
               const Box& bx = mfi.growntilebox();
               const auto& du       = divu->array(mfi);
               const auto& dsdt_arr = dsdt->array(mfi);
               const auto& rhcc_arr = rhcclev->array(mfi);
               amrex::ParallelFor(bx, [du,dsdt_arr,rhcc_arr,dt_inv]
               AMREX_GPU_DEVICE (int i, int j, int k) noexcept
               {
                  rhcc_arr(i,j,k) = ( dsdt_arr(i,j,k) - du(i,j,k) ) * dt_inv;
               });
            }
        }
    }

    //
    // Set velocity bndry values to bogus values.
    //
    for (lev = c_lev; lev <= f_lev; lev++)
    {
        vel[lev]->setBndry(BogusValue,Xvel,AMREX_SPACEDIM);
        MultiFab &u_o = LevelData[lev]->get_old_data(State_Type);
        u_o.setBndry(BogusValue,Xvel,AMREX_SPACEDIM);
        sig[lev]->setBndry(BogusValue);
    }

    //
    // Convert velocities to accelerations (we always do this for the
    //  projections in these initial iterations).
    //
    for (lev = c_lev; lev <= f_lev; lev++)
    {
        MultiFab& S_old = LevelData[lev]->get_old_data(State_Type);
        MultiFab& S_new = LevelData[lev]->get_new_data(State_Type);

        Real prev_time = LevelData[lev]->get_state_data(State_Type).prevTime();
        Real curr_time = LevelData[lev]->get_state_data(State_Type).curTime();

        for (MFIter mfi(S_new); mfi.isValid(); ++mfi)
        {
            LevelData[lev]->setPhysBoundaryValues(S_old[mfi],State_Type,prev_time,Xvel,Xvel,AMREX_SPACEDIM);
            LevelData[lev]->setPhysBoundaryValues(S_new[mfi],State_Type,curr_time,Xvel,Xvel,AMREX_SPACEDIM);
        }

        MultiFab& u_o = LevelData[lev]->get_old_data(State_Type);
        ConvertUnew(*vel[lev], u_o, dt, LevelData[lev]->boxArray());
    }

    if (OutFlowBC::HasOutFlowBC(phys_bc) && have_divu && do_outflow_bcs) {
        set_outflow_bcs(INITIAL_SYNC,phi,vel,
                        amrex::GetVecOfPtrs(rhcc),
                        sig,c_lev,f_lev,have_divu);
    }

    //
    // Scale initial sync projection variables.
    //
    for (lev = c_lev; lev <= f_lev; lev++)
    {
        scaleVar(sig[lev],1,vel[lev],lev);

        if (have_divu && parent->Geom(0).IsRZ())
          radMultScal(lev,*(rhcc[lev]));
    }

    for (lev = f_lev; lev >= c_lev+1; lev--) {
      const BoxArray& crse_grids = vel[lev-1]->boxArray();
      const BoxArray& fine_grids = vel[lev  ]->boxArray();
      const DistributionMapping& crse_dmap = vel[lev-1]->DistributionMap();
      const DistributionMapping& fine_dmap = vel[lev  ]->DistributionMap();

      MultiFab v_crse(crse_grids, crse_dmap, AMREX_SPACEDIM, 1, MFInfo(), LevelData[lev-1]->Factory());
      MultiFab v_fine(fine_grids, fine_dmap, AMREX_SPACEDIM, 1, MFInfo(), LevelData[lev]->Factory());

      MultiFab::Copy(v_crse, *vel[lev-1], 0, 0, AMREX_SPACEDIM, 1);
      MultiFab::Copy(v_fine, *vel[lev  ], 0, 0, AMREX_SPACEDIM, 1);

      NavierStokesBase* ns = dynamic_cast<NavierStokesBase*>(LevelData[lev-1]);
      ns->average_down(v_fine, v_crse, 0, v_crse.nComp());

      MultiFab::Copy(*vel[lev-1], v_crse, 0, 0, AMREX_SPACEDIM, 1);
    }

    //
    // Project.
    //
    if (have_divu) {
        for (lev = c_lev; lev <= f_lev; lev++)
        {
            rhcc[lev]->mult(-1.0,0,1);
        }
    }

    bool increment_gp = true;
    doMLMGNodalProjection(c_lev, f_lev-c_lev+1, vel, phi, sig,
                          amrex::GetVecOfPtrs(rhcc),
                          {}, proj_tol, proj_abs_tol, increment_gp, 0, 0);

    //
    // Unscale initial sync projection variables.
    //
    for (lev = c_lev; lev <= f_lev; lev++)
        rescaleVar(sig[lev],1,vel[lev],lev);

    //
    // Add correction at coarse and fine levels.
    // Only update new. NSB::resetState will take care of setting
    // old = new
    //
    for (lev = c_lev; lev <= f_lev; lev++)
    {
        MultiFab& P_new = LevelData[lev]->get_new_data(Press_Type);
        MultiFab::Add(P_new, *phi[lev], 0, 0, 1, 1);
    }

    //
    // Grad(P_new) incremented in doMLMGNodalProjection.
    //

    if (verbose)
    {
        const int IOProc   = ParallelDescriptor::IOProcessorNumber();
        Real      run_time = ParallelDescriptor::second() - stime;

        ParallelDescriptor::ReduceRealMax(run_time,IOProc);

        amrex::Print() << "Projection::initialSyncProject(): time: " << run_time << '\n';
    }
}